

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Compiler::is_builtin_variable(Compiler *this,SPIRVariable *var)

{
  bool bVar1;
  Meta *pMVar2;
  SPIRType *type;
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)(var->super_IVariant).self.id);
  if ((var->compat_builtin == false) &&
     ((pMVar2 == (Meta *)0x0 || ((pMVar2->decoration).builtin == false)))) {
    type = get<diligent_spirv_cross::SPIRType>(this,*(uint32_t *)&(var->super_IVariant).field_0xc);
    bVar1 = is_builtin_type(this,type);
    return bVar1;
  }
  return true;
}

Assistant:

bool Compiler::is_builtin_variable(const SPIRVariable &var) const
{
	auto *m = ir.find_meta(var.self);

	if (var.compat_builtin || (m && m->decoration.builtin))
		return true;
	else
		return is_builtin_type(get<SPIRType>(var.basetype));
}